

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbgmsg.cpp
# Opt level: O3

int DBG_printf_c99(DBG_CHANNEL_ID channel,DBG_LEVEL_ID level,BOOL bHeader,LPSTR file,INT line,
                  LPSTR format,...)

{
  uint uVar1;
  uint __errnum;
  long lVar2;
  FILE *__stream;
  char in_AL;
  BOOL BVar3;
  int iVar4;
  INT IVar5;
  CPalThread *pThread;
  uint *puVar6;
  long lVar7;
  char *pcVar8;
  char *indent_string;
  long in_FS_OFFSET;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_4f88 [48];
  undefined8 local_4f58;
  undefined8 local_4f48;
  undefined8 local_4f38;
  undefined8 local_4f28;
  undefined8 local_4f18;
  undefined8 local_4f08;
  undefined8 local_4ef8;
  undefined8 local_4ee8;
  undefined1 local_4ed8 [8];
  va_list args;
  char local_4e98 [20000];
  char local_78 [8];
  CHAR indent [51];
  
  if (in_AL != '\0') {
    local_4f58 = in_XMM0_Qa;
    local_4f48 = in_XMM1_Qa;
    local_4f38 = in_XMM2_Qa;
    local_4f28 = in_XMM3_Qa;
    local_4f18 = in_XMM4_Qa;
    local_4f08 = in_XMM5_Qa;
    local_4ef8 = in_XMM6_Qa;
    local_4ee8 = in_XMM7_Qa;
  }
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  args[0].reg_save_area = format;
  pThread = (CPalThread *)pthread_getspecific(CorUnix::thObjKey);
  if (pThread == (CPalThread *)0x0) {
    pThread = CreateCurrentThreadData();
  }
  puVar6 = (uint *)__errno_location();
  uVar1 = *puVar6;
  BVar3 = DBG_get_indent(level,local_78,indent_string);
  if (BVar3 != 0) {
    iVar4 = 0;
    lVar7 = syscall(0xba);
    if (bHeader == 0) {
      pcVar8 = local_4e98;
    }
    else {
      iVar4 = snprintf(local_4e98,20000,"{%p-%p} %-5s [%-7s] at %s.%d: ",lVar7,DBG_get_module_id,
                       dbg_level_names[level],dbg_channel_names[channel],file,_line);
      if (20000 < iVar4 + 1) {
        fprintf(_stderr,"ERROR : buffer overflow in DBG_printf_gcc");
        goto LAB_00132958;
      }
      pcVar8 = local_4e98 + iVar4;
    }
    args[0].overflow_arg_area = local_4f88;
    args[0]._0_8_ = &stack0x00000008;
    local_4ed8._0_4_ = 0x30;
    local_4ed8._4_4_ = 0x30;
    IVar5 = Silent_PAL_vsnprintf
                      (pcVar8,20000 - iVar4,(LPCSTR)args[0].reg_save_area,
                       (__va_list_tag *)local_4ed8);
    if (20000 < IVar5 + iVar4) {
      fprintf(_stderr,"ERROR : buffer overflow in DBG_printf_c99");
    }
    CorUnix::InternalEnterCriticalSection(pThread,&fprintf_crit_section);
    fprintf((FILE *)output_file,"%s",local_4e98);
    CorUnix::InternalLeaveCriticalSection(pThread,&fprintf_crit_section);
    DBG_printf_c99::call_count = DBG_printf_c99::call_count + 1;
    if (5 < DBG_printf_c99::call_count) {
      DBG_printf_c99::call_count = 0;
      iVar4 = fflush((FILE *)output_file);
      __stream = _stderr;
      if (iVar4 != 0) {
        __errnum = *puVar6;
        pcVar8 = strerror(__errnum);
        fprintf(__stream,"ERROR : fflush() failed errno:%d (%s)\n",(ulong)__errnum,pcVar8);
      }
    }
    if (uVar1 != *puVar6) {
      fprintf(_stderr,"ERROR: DBG_printf_c99 changed the errno.\n");
      *puVar6 = uVar1;
    }
  }
LAB_00132958:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return 1;
  }
  __stack_chk_fail();
}

Assistant:

int DBG_printf_c99(DBG_CHANNEL_ID channel, DBG_LEVEL_ID level, BOOL bHeader,
                   LPSTR file, INT line, LPSTR format, ...)
{
    CHAR *buffer = (CHAR*)alloca(DBG_BUFFER_SIZE);
    CHAR indent[MAX_NESTING+1];
    LPSTR buffer_ptr;
    INT output_size;
    va_list args;
    static INT call_count=0;
    void *thread_id;
    int old_errno = 0;
    CPalThread *pthrCurrent = InternalGetCurrentThread();

    old_errno = errno;

    if(!DBG_get_indent(level, format, indent))
    {
        return 1;
    }

    thread_id=  (void *)THREADSilentGetCurrentThreadId();

    if(bHeader)
    {
        output_size=snprintf(buffer, DBG_BUFFER_SIZE,
                             "{%p" MODULE_FORMAT "} %-5s [%-7s] at %s.%d: ", thread_id, MODULE_ID
                             dbg_level_names[level], dbg_channel_names[channel],
                             file, line);

        if(output_size + 1 > DBG_BUFFER_SIZE)
        {
            fprintf(stderr, "ERROR : buffer overflow in DBG_printf_gcc");
            return 1;
        }

        buffer_ptr=buffer+output_size;
    }
    else
    {
        output_size = 0;
        buffer_ptr = buffer;
    }

    va_start(args, format);
    output_size+=Silent_PAL_vsnprintf(buffer_ptr, DBG_BUFFER_SIZE-output_size,
                                      format, args);
    va_end(args);

    if(output_size>DBG_BUFFER_SIZE)
        fprintf(stderr, "ERROR : buffer overflow in DBG_printf_c99");

    /* Use a Critical section before calling printf code to
       avoid holding a libc lock while another thread is calling
       SuspendThread on this one. */

    InternalEnterCriticalSection(pthrCurrent, &fprintf_crit_section);
    fprintf( output_file, "%s", buffer );
    InternalLeaveCriticalSection(pthrCurrent, &fprintf_crit_section);

    /* flush the output to file every once in a while */
    call_count++;
    if(call_count>5)
    {
        call_count=0;
        if ( fflush(output_file) != 0 )
        {
            fprintf(stderr, "ERROR : fflush() failed errno:%d (%s)\n",
                   errno, strerror(errno));
        }
    }

    if ( old_errno != errno )
    {
        fprintf( stderr, "ERROR: DBG_printf_c99 changed the errno.\n" );
        errno = old_errno;
    }

    return 1;
}